

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

size_t http_date2rfc2822(char *target,tm_conflict *tmbuf)

{
  char *pcVar1;
  uint uVar2;
  char cVar3;
  long lVar4;
  size_t sVar5;
  
  *target = *DAY_NAMES[tmbuf->tm_wday];
  target[1] = DAY_NAMES[tmbuf->tm_wday][1];
  target[2] = DAY_NAMES[tmbuf->tm_wday][2];
  target[3] = ',';
  target[4] = ' ';
  uVar2 = tmbuf->tm_mday;
  if ((int)uVar2 < 10) {
    target[5] = (char)uVar2 + '0';
    lVar4 = 6;
  }
  else {
    target[5] = (char)(uVar2 / 10) + '0';
    target[6] = (char)(uVar2 / 10) * -10 + (char)tmbuf->tm_mday + '0';
    lVar4 = 7;
  }
  pcVar1 = target + lVar4;
  *pcVar1 = '-';
  pcVar1[1] = *MONTH_NAMES[tmbuf->tm_mon];
  pcVar1[2] = MONTH_NAMES[tmbuf->tm_mon][1];
  pcVar1[3] = MONTH_NAMES[tmbuf->tm_mon][2];
  pcVar1[4] = '-';
  sVar5 = fio_ltoa(pcVar1 + 5,(long)tmbuf->tm_year + 0x76c,'\n');
  lVar4 = sVar5 + lVar4;
  target[lVar4 + 5] = ' ';
  cVar3 = (char)(tmbuf->tm_hour / 10);
  target[lVar4 + 6] = cVar3 + '0';
  target[lVar4 + 7] = cVar3 * -10 + (char)tmbuf->tm_hour + '0';
  target[lVar4 + 8] = ':';
  cVar3 = (char)(tmbuf->tm_min / 10);
  target[lVar4 + 9] = cVar3 + '0';
  target[lVar4 + 10] = cVar3 * -10 + (char)tmbuf->tm_min + '0';
  target[lVar4 + 0xb] = ':';
  cVar3 = (char)(tmbuf->tm_sec / 10);
  target[lVar4 + 0xc] = cVar3 + '0';
  target[lVar4 + 0xd] = cVar3 * -10 + (char)tmbuf->tm_sec + '0';
  pcVar1 = target + lVar4 + 0xe;
  pcVar1[0] = ' ';
  pcVar1[1] = 'G';
  pcVar1[2] = 'M';
  pcVar1[3] = 'T';
  target[lVar4 + 0x12] = '\0';
  return (long)(target + lVar4 + 0x12) - (long)target;
}

Assistant:

size_t http_date2rfc2822(char *target, struct tm *tmbuf) {
  /* note: day of month is either 1 or 2 digits */
  char *pos = target;
  uint16_t tmp;
  pos[0] = DAY_NAMES[tmbuf->tm_wday][0];
  pos[1] = DAY_NAMES[tmbuf->tm_wday][1];
  pos[2] = DAY_NAMES[tmbuf->tm_wday][2];
  pos[3] = ',';
  pos[4] = ' ';
  pos += 5;
  if (tmbuf->tm_mday < 10) {
    *pos = '0' + tmbuf->tm_mday;
    ++pos;
  } else {
    tmp = tmbuf->tm_mday / 10;
    pos[0] = '0' + tmp;
    pos[1] = '0' + (tmbuf->tm_mday - (tmp * 10));
    pos += 2;
  }
  *(pos++) = '-';
  pos[0] = MONTH_NAMES[tmbuf->tm_mon][0];
  pos[1] = MONTH_NAMES[tmbuf->tm_mon][1];
  pos[2] = MONTH_NAMES[tmbuf->tm_mon][2];
  pos += 3;
  *(pos++) = '-';
  // write year.
  pos += fio_ltoa(pos, tmbuf->tm_year + 1900, 10);
  *(pos++) = ' ';
  tmp = tmbuf->tm_hour / 10;
  pos[0] = '0' + tmp;
  pos[1] = '0' + (tmbuf->tm_hour - (tmp * 10));
  pos[2] = ':';
  tmp = tmbuf->tm_min / 10;
  pos[3] = '0' + tmp;
  pos[4] = '0' + (tmbuf->tm_min - (tmp * 10));
  pos[5] = ':';
  tmp = tmbuf->tm_sec / 10;
  pos[6] = '0' + tmp;
  pos[7] = '0' + (tmbuf->tm_sec - (tmp * 10));
  pos += 8;
  pos[0] = ' ';
  pos[1] = GMT_STR[0];
  pos[2] = GMT_STR[1];
  pos[3] = GMT_STR[2];
  pos[4] = 0;
  pos += 4;
  return pos - target;
}